

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::~Connection(Connection *this)

{
  SessionOutgoing *in_RDI;
  
  ((_Head_base<0UL,_asio::io_context::strand_*,_false> *)
  &(((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      *)&(in_RDI->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing)->_M_t).
   super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
   .
   super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
  )->_M_head_impl = (strand *)&PTR__Connection_00310790;
  (in_RDI->super_OutgoingQueueCommon).WriteAllocator.Allocator.PreferredWindows.PreallocatedData[5]
       = (WindowHeader *)&PTR__Connection_003107d0;
  std::__atomic_base<int>::operator--((__atomic_base<int> *)&ActiveConnectionCount,0);
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  ~unique_ptr((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
               *)in_RDI);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                 *)in_RDI);
  std::unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::~unique_ptr
            ((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)in_RDI)
  ;
  std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
  ~unique_ptr((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
               *)in_RDI);
  SessionIncoming::~SessionIncoming((SessionIncoming *)0x19d173);
  SessionOutgoing::~SessionOutgoing(in_RDI);
  logger::Channel::~Channel((Channel *)0x19d195);
  Dependencies::~Dependencies((Dependencies *)0x19d1a3);
  IIncomingHandler::~IIncomingHandler
            ((IIncomingHandler *)
             ((in_RDI->super_OutgoingQueueCommon).WriteAllocator.Allocator.PreferredWindows.
              PreallocatedData + 5));
  IConnection::~IConnection((IConnection *)0x19d1bb);
  return;
}

Assistant:

Connection::~Connection()
{
    ActiveConnectionCount--;
}